

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp.c
# Opt level: O3

MPP_RET dequeue(Kmpp *ctx,MppPortType type,MppTask *task)

{
  return -(uint)(ctx->mInitDone != 0) | MPP_ERR_INIT;
}

Assistant:

static MPP_RET dequeue(Kmpp *ctx, MppPortType type, MppTask *task)
{
    MPP_RET ret = MPP_NOK;
    (void)type;
    (void)task;

    if (!ctx->mInitDone)
        return MPP_ERR_INIT;

    return ret;
}